

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_sock_set_pipe_cb(nni_sock *s,int ev,nng_pipe_cb cb,void *arg)

{
  void *arg_local;
  nng_pipe_cb cb_local;
  int ev_local;
  nni_sock *s_local;
  
  if ((0 < ev) && (ev < 4)) {
    nni_mtx_lock(&s->s_pipe_cbs_mtx);
    s->s_pipe_cbs[ev].cb_fn = cb;
    s->s_pipe_cbs[ev].cb_arg = arg;
    s->s_want_evs = false;
    for (cb_local._4_4_ = 0; cb_local._4_4_ < 4; cb_local._4_4_ = cb_local._4_4_ + 1) {
      if (s->s_pipe_cbs[cb_local._4_4_].cb_fn != (nng_pipe_cb)0x0) {
        s->s_want_evs = true;
      }
    }
    nni_mtx_unlock(&s->s_pipe_cbs_mtx);
  }
  return;
}

Assistant:

void
nni_sock_set_pipe_cb(nni_sock *s, int ev, nng_pipe_cb cb, void *arg)
{
	if ((ev > NNG_PIPE_EV_NONE) && (ev < NNG_PIPE_EV_NUM)) {
		nni_mtx_lock(&s->s_pipe_cbs_mtx);
		s->s_pipe_cbs[ev].cb_fn  = cb;
		s->s_pipe_cbs[ev].cb_arg = arg;
		s->s_want_evs            = false;
		for (ev = NNG_PIPE_EV_NONE; ev < NNG_PIPE_EV_NUM; ev++) {
			if (s->s_pipe_cbs[ev].cb_fn != NULL) {
				s->s_want_evs = true;
			}
		}
		nni_mtx_unlock(&s->s_pipe_cbs_mtx);
	}
}